

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O0

TPZGeoEl * __thiscall
TPZGeoMesh::FindCloseElement
          (TPZGeoMesh *this,TPZVec<double> *x,int64_t *InitialElIndex,int targetDim)

{
  double dVar1;
  double dVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int64_t iVar7;
  TPZGeoEl **ppTVar8;
  double *pdVar9;
  mapped_type_conflict4 *pmVar10;
  pointer ppVar11;
  TPZGeoEl *pTVar12;
  size_type sVar13;
  int in_ECX;
  long *in_RDX;
  TPZVec<double> *in_RSI;
  TPZGeoMesh *in_RDI;
  REAL gelnextdist;
  REAL distcenter;
  TPZGeoElSide centerneigh;
  TPZManVector<double,_3> center;
  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> distneigh;
  TPZGeoElSide neighbour;
  TPZGeoElSide gelside;
  REAL closestcorner;
  TPZGeoElSide gelside_1;
  TPZManVector<double,_3> xcenter_1;
  int i;
  REAL dist;
  TPZManVector<double,_3> xcorner;
  int ic;
  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> cornerdist;
  REAL geldist;
  TPZGeoEl *gel;
  TPZGeoEl *gelnext;
  TPZManVector<TPZManVector<double,_3>,_8> cornercenter;
  TPZManVector<double,_3> xcenter;
  TPZGeoElSide *in_stack_fffffffffffffaa8;
  TPZManVector<double,_3> *in_stack_fffffffffffffab0;
  TPZGeoEl *in_stack_fffffffffffffab8;
  TPZManVector<TPZManVector<double,_3>,_8> *in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac8;
  mapped_type_conflict4 in_stack_fffffffffffffacc;
  TPZChunkVector<TPZGeoEl_*,_10> *in_stack_fffffffffffffad0;
  TPZVec<double> *in_stack_fffffffffffffad8;
  TPZGeoEl *in_stack_fffffffffffffae0;
  key_type_conflict *in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  TPZGeoEl *in_stack_fffffffffffffaf8;
  TPZGeoEl *in_stack_fffffffffffffb00;
  int64_t in_stack_fffffffffffffb48;
  TPZManVector<TPZManVector<double,_3>,_8> *in_stack_fffffffffffffb50;
  double dVar14;
  double local_430;
  TPZGeoElSide local_388;
  _Base_ptr local_370;
  TPZGeoElSide local_368;
  uint local_34c;
  _Base_ptr local_348;
  double local_340;
  int local_2e4;
  double local_2e0;
  TPZVec<double> local_2d8;
  int local_29c;
  REAL local_268;
  TPZGeoEl *local_260;
  TPZGeoEl *local_258;
  size_t in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  TPZGeoEl *local_8;
  
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffffad0,
             CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  TPZManVector<TPZManVector<double,_3>,_8>::TPZManVector
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  lVar3 = *in_RDX;
  iVar7 = TPZChunkVector<TPZGeoEl_*,_10>::NElements
                    (&(in_RDI->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>);
  if (iVar7 <= lVar3) {
    pzinternal::DebugStopImpl(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  }
  ElementVec(in_RDI);
  ppTVar8 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                      (in_stack_fffffffffffffad0,
                       CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  local_258 = *ppTVar8;
  if (local_258 == (TPZGeoEl *)0x0) {
    pzinternal::DebugStopImpl(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  }
  local_260 = (TPZGeoEl *)0x0;
  std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::map
            ((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> *)
             0x1a2805a);
  while( true ) {
    if (local_260 == local_258) {
      iVar7 = TPZGeoEl::Index(local_260);
      *in_RDX = iVar7;
      local_8 = local_260;
      local_34c = 1;
      goto LAB_01a28954;
    }
    local_260 = local_258;
    local_258 = (TPZGeoEl *)0x0;
    std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::clear
              ((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                *)0x1a28099);
    for (local_29c = 0; iVar6 = local_29c, iVar5 = (**(code **)(*(long *)local_260 + 0x98))(),
        iVar6 < iVar5; local_29c = local_29c + 1) {
      TPZManVector<double,_3>::TPZManVector
                ((TPZManVector<double,_3> *)in_stack_fffffffffffffad0,
                 CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
      TPZGeoEl::NodePtr((TPZGeoEl *)in_stack_fffffffffffffac0,
                        (int)((ulong)in_stack_fffffffffffffab8 >> 0x20));
      TPZGeoNode::GetCoordinates
                ((TPZGeoNode *)in_stack_fffffffffffffac0,(TPZVec<double> *)in_stack_fffffffffffffab8
                );
      local_2e0 = 0.0;
      for (local_2e4 = 0; local_2e4 < 3; local_2e4 = local_2e4 + 1) {
        pdVar9 = TPZVec<double>::operator[](in_RSI,(long)local_2e4);
        dVar1 = *pdVar9;
        pdVar9 = TPZVec<double>::operator[](&local_2d8,(long)local_2e4);
        dVar2 = *pdVar9;
        pdVar9 = TPZVec<double>::operator[](in_RSI,(long)local_2e4);
        dVar14 = *pdVar9;
        pdVar9 = TPZVec<double>::operator[](&local_2d8,(long)local_2e4);
        local_2e0 = (dVar1 - dVar2) * (dVar14 - *pdVar9) + local_2e0;
      }
      local_2e0 = sqrt(local_2e0);
      iVar6 = local_29c;
      pmVar10 = std::
                map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                ::operator[]((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                              *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                             in_stack_fffffffffffffae8);
      *pmVar10 = iVar6;
      TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffab0);
    }
    local_268 = 0.0;
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)in_stack_fffffffffffffad0,
               CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    (**(code **)(*(long *)local_260 + 0xf0))();
    TPZGeoElSide::TPZGeoElSide
              ((TPZGeoElSide *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
               (int)((ulong)in_stack_fffffffffffffab0 >> 0x20));
    TPZGeoElSide::CenterX
              ((TPZGeoElSide *)in_stack_fffffffffffffb00,(TPZVec<double> *)in_stack_fffffffffffffaf8
              );
    local_268 = dist<double>((TPZVec<double> *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1a283db);
    TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffab0);
    local_348 = (_Base_ptr)
                std::
                map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                ::begin((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                         *)in_stack_fffffffffffffaa8);
    ppVar11 = std::_Rb_tree_iterator<std::pair<const_double,_int>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_double,_int>_> *)0x1a2840a);
    local_340 = ppVar11->first;
    if ((local_268 < local_340) || (local_340 < 1e-15)) break;
    local_370 = (_Base_ptr)
                std::
                map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                ::begin((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                         *)in_stack_fffffffffffffaa8);
    std::_Rb_tree_iterator<std::pair<const_double,_int>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_double,_int>_> *)0x1a28508);
    TPZGeoElSide::TPZGeoElSide
              ((TPZGeoElSide *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
               (int)((ulong)in_stack_fffffffffffffab0 >> 0x20));
    TPZGeoElSide::Neighbour((TPZGeoElSide *)in_stack_fffffffffffffab8);
    std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::map
              ((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                *)0x1a28543);
    while (iVar6 = TPZGeoElSide::operator!=(&local_388,&local_368), iVar6 != 0) {
      pTVar12 = TPZGeoElSide::Element(&local_388);
      iVar6 = (**(code **)(*(long *)pTVar12 + 0x210))();
      if (iVar6 == in_ECX) {
        TPZManVector<double,_3>::TPZManVector
                  ((TPZManVector<double,_3> *)in_stack_fffffffffffffad0,
                   CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
        in_stack_fffffffffffffb00 = TPZGeoElSide::Element(&local_388);
        in_stack_fffffffffffffaf8 = TPZGeoElSide::Element(&local_388);
        in_stack_fffffffffffffaf4 = (**(code **)(*(long *)in_stack_fffffffffffffaf8 + 0xf0))();
        TPZGeoElSide::TPZGeoElSide
                  ((TPZGeoElSide *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                   (int)((ulong)in_stack_fffffffffffffab0 >> 0x20));
        TPZGeoElSide::CenterX
                  ((TPZGeoElSide *)in_stack_fffffffffffffb00,
                   (TPZVec<double> *)in_stack_fffffffffffffaf8);
        in_stack_fffffffffffffae8 =
             (key_type_conflict *)
             dist<double>((TPZVec<double> *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
        in_stack_fffffffffffffae0 = TPZGeoElSide::Element(&local_388);
        in_stack_fffffffffffffad8 = (TPZVec<double> *)TPZGeoEl::Index(in_stack_fffffffffffffae0);
        in_stack_fffffffffffffacc = (mapped_type_conflict4)in_stack_fffffffffffffad8;
        in_stack_fffffffffffffad0 =
             (TPZChunkVector<TPZGeoEl_*,_10> *)
             std::
             map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::
             operator[]((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                         *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                        in_stack_fffffffffffffae8);
        *(mapped_type_conflict4 *)&(in_stack_fffffffffffffad0->super_TPZSavable)._vptr_TPZSavable =
             in_stack_fffffffffffffacc;
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1a286b9);
        TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffab0);
      }
      TPZGeoElSide::Neighbour((TPZGeoElSide *)in_stack_fffffffffffffab8);
      TPZGeoElSide::operator=((TPZGeoElSide *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1a2877c);
    }
    sVar13 = std::
             map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::
             size((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                   *)0x1a2879a);
    if (sVar13 == 0) {
      local_258 = local_260;
      local_430 = local_268;
    }
    else {
      in_stack_fffffffffffffac0 = (TPZManVector<TPZManVector<double,_3>,_8> *)ElementVec(in_RDI);
      std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::
      begin((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> *)
            in_stack_fffffffffffffaa8);
      std::_Rb_tree_iterator<std::pair<const_double,_int>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_double,_int>_> *)0x1a287fd);
      in_stack_fffffffffffffab8 =
           (TPZGeoEl *)
           TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                     (in_stack_fffffffffffffad0,
                      CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
      local_258 = *(TPZGeoEl **)in_stack_fffffffffffffab8;
      std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::
      begin((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> *)
            in_stack_fffffffffffffaa8);
      ppVar11 = std::_Rb_tree_iterator<std::pair<const_double,_int>_>::operator->
                          ((_Rb_tree_iterator<std::pair<const_double,_int>_> *)0x1a28844);
      local_430 = ppVar11->first;
    }
    bVar4 = local_268 <= local_430;
    if (bVar4) {
      in_stack_fffffffffffffab0 = (TPZManVector<double,_3> *)TPZGeoEl::Index(local_260);
      *in_RDX = (long)in_stack_fffffffffffffab0;
      local_8 = local_260;
    }
    local_34c = (uint)bVar4;
    std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::~map
              ((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                *)0x1a288c2);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1a288cf);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1a288dc);
    if (local_34c != 0) {
LAB_01a28954:
      std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::~map
                ((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                  *)0x1a28961);
      TPZManVector<TPZManVector<double,_3>,_8>::~TPZManVector(in_stack_fffffffffffffac0);
      TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffab0);
      return local_8;
    }
  }
  iVar7 = TPZGeoEl::Index(local_260);
  *in_RDX = iVar7;
  local_8 = local_260;
  local_34c = 1;
  goto LAB_01a28954;
}

Assistant:

TPZGeoEl * TPZGeoMesh::FindCloseElement(TPZVec<REAL> &x, int64_t & InitialElIndex, int targetDim) const
{
    // this method will not work if targetDim == 0 because it navigates through elements of dimension targetDim
    TPZManVector<REAL,3> xcenter(3);
    TPZManVector<TPZManVector<REAL, 3>, 8> cornercenter;
    // what happens if gelnext == 0 or if InitialIndex is out of scope??
    if (InitialElIndex >= fElementVec.NElements()) {
        DebugStop();
    }
    TPZGeoEl *gelnext = ElementVec()[InitialElIndex];
    
    if (gelnext == 0) {
        DebugStop();
    }
    
    TPZGeoEl *gel = 0;
    REAL geldist;
    std::map<REAL,int> cornerdist;
    while (gel != gelnext) {
        gel = gelnext;
        gelnext = 0;
        cornerdist.clear();
        // compute the corner coordinates
        for (int ic=0; ic<gel->NCornerNodes(); ic++) {
            TPZManVector<REAL,3> xcorner(3);
            gel->NodePtr(ic)->GetCoordinates(xcorner);
            REAL dist = 0.;
            for (int i=0; i<3; i++) {
                dist += (x[i]-xcorner[i])*(x[i]-xcorner[i]);
            }
            dist = sqrt(dist);
            cornerdist[dist]=ic;
        }
        // compute the distance of the center of the element
        {
            geldist = 0.;
            TPZManVector<REAL,3> xcenter(3);
            TPZGeoElSide gelside(gel,gel->NSides()-1);
            gelside.CenterX(xcenter);
            geldist = dist(x,xcenter);
        }
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            std::stringstream sout;
            sout << "FindClosestElement Tried element index " << gel->Index() << std::endl;
            sout << "Distance from the center " << geldist << std::endl;
            LOGPZ_DEBUG(logger, sout.str())
        }
#endif
        // find the closest corner node
        REAL closestcorner = cornerdist.begin()->first;
        // if the center node is closer than the cornernode, return the element
        if (geldist < closestcorner || closestcorner < 1.e-15) {
#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "Distance from the closest corner " << closestcorner << "bailing out " << std::endl;
                LOGPZ_DEBUG(logger, sout.str())
            }
#endif
            InitialElIndex = gel->Index();
            return gel;
        }
        // look for all neighbours of the corner side
        TPZGeoElSide gelside(gel,cornerdist.begin()->second);
        TPZGeoElSide neighbour = gelside.Neighbour();
        std::map<REAL,int> distneigh;
        while (neighbour != gelside)
        {
            if (neighbour.Element()->Dimension() == targetDim)
            {
                TPZManVector<REAL,3> center(3);
                TPZGeoElSide centerneigh(neighbour.Element(),neighbour.Element()->NSides()-1);
                centerneigh.CenterX(center);
                REAL distcenter = dist(center,x);
                distneigh[distcenter] = neighbour.Element()->Index();
            }
            neighbour = neighbour.Neighbour();
        }
        // choose the element whose center is closest to the coordinate
        REAL gelnextdist = 0.;
        if (distneigh.size() == 0) {
            gelnext = gel;
            gelnextdist = geldist;
        }
        else {
            gelnext = ElementVec()[distneigh.begin()->second];
            gelnextdist = distneigh.begin()->first;
        }
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            std::stringstream sout;
            sout << "Closest element index " << gelnext->Index() << std::endl;
            sout << "Distance from the center " << gelnextdist << std::endl;
            LOGPZ_DEBUG(logger, sout.str())
        }
#endif
        // return if its center distance is larger than the distance of the current element
        if (geldist <= gelnextdist) {
            InitialElIndex = gel->Index();
            return gel;
        }
    }
    InitialElIndex = gel->Index();
    return gel;
}